

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 floatx80_logn_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined8 uVar5;
  uint64_t uVar6;
  undefined4 uVar7;
  short sVar8;
  undefined4 uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 a_09;
  floatx80 a_10;
  floatx80 a_11;
  floatx80 a_12;
  floatx80 a_13;
  floatx80 a_14;
  floatx80 a_15;
  floatx80 a_16;
  floatx80 a_17;
  floatx80 a_18;
  floatx80 a_19;
  floatx80 a_20;
  floatx80 a_21;
  floatx80 a_22;
  floatx80 a_23;
  floatx80 a_24;
  floatx80 a_25;
  floatx80 a_26;
  floatx80 a_27;
  floatx80 a_28;
  floatx80 a_29;
  floatx80 a_30;
  floatx80 fVar13;
  floatx80 fVar14;
  floatx80 fVar15;
  floatx80 fVar16;
  floatx80 fVar17;
  floatx80 fVar18;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 b_03;
  floatx80 b_04;
  floatx80 b_05;
  floatx80 b_06;
  floatx80 b_07;
  floatx80 b_08;
  floatx80 b_09;
  floatx80 b_10;
  floatx80 b_11;
  floatx80 b_12;
  floatx80 b_13;
  floatx80 b_14;
  floatx80 b_15;
  floatx80 b_16;
  floatx80 b_17;
  floatx80 b_18;
  floatx80 b_19;
  floatx80 b_20;
  floatx80 b_21;
  floatx80 b_22;
  floatx80 b_23;
  floatx80 b_24;
  floatx80 b_25;
  floatx80 b_26;
  floatx80 b_27;
  floatx80 b_28;
  floatx80 b_29;
  floatx80 b_30;
  floatx80 b_31;
  floatx80 b_32;
  floatx80 b_33;
  int32_t aExp;
  uint64_t aSig;
  uint local_64;
  uint64_t local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined8 local_50;
  ulong local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  fVar13.low = a.low;
  uVar11 = a._8_4_;
  uVar10 = a._8_8_ & 0xffffffff;
  local_64 = uVar11 & 0x7fff;
  sVar8 = (short)uVar10;
  local_50 = fVar13.low;
  if ((~uVar11 & 0x7fff) == 0) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      fVar13._8_8_ = uVar10;
      propagateFloatx80NaNOneArg(fVar13,status);
    }
    if (-1 < sVar8) {
      uVar9 = 0x7fff;
      fVar13.low = 0;
      goto LAB_006f07c2;
    }
  }
  iVar12 = -0x3fff;
  if (local_64 == 0) {
    if (local_50 == 0) {
      float_raise_m68k('\x04',status);
      fVar13.low = 0;
      uVar9 = 0xffff;
      goto LAB_006f07c2;
    }
    if (-1 < (long)local_50) {
      normalizeFloatx80Subnormal_m68k(local_50,(int32_t *)&local_64,&local_50);
      uVar10 = (ulong)((uVar11 & 0xffff8000) + local_64 + 100);
      iVar12 = -0x4063;
      fVar13.low = local_50;
      local_64 = local_64 + 100;
    }
  }
  if (sVar8 < 0) {
    float_raise_m68k('\x01',status);
    fVar13 = floatx80_default_nan_m68k(status);
    uVar9 = fVar13._8_4_;
  }
  else {
    cVar1 = status->float_rounding_mode;
    cVar2 = status->floatx80_rounding_precision;
    status->float_rounding_mode = '\0';
    status->floatx80_rounding_precision = 'P';
    if ((uint)local_50._6_2_ + local_64 * 0x10000 + 0xc00077be < 0xffff683b) {
      fVar13 = int32_to_floatx80_m68k(iVar12 + local_64,status);
      b.low = local_50 & 0xfe00000000000000 | 0x100000000000000;
      uVar10 = local_50 >> 0x38;
      a_00._8_8_ = 0x3fff;
      a_00.low = local_50;
      b._8_8_ = 0x3fff;
      fVar14 = floatx80_sub_m68k(a_00,b,status);
      local_48 = (ulong)(((byte)uVar10 & 0x7e) << 4);
      auVar3 = fVar14._0_12_;
      a_01._12_4_ = 0;
      a_01.low = auVar3._0_8_;
      a_01.high = auVar3._8_2_;
      a_01._10_2_ = auVar3._10_2_;
      b_00._12_4_ = 0;
      b_00._0_12_ = *(undefined1 (*) [12])((long)&log_tbl[0].low + local_48);
      fVar14 = floatx80_mul_m68k(a_01,b_00,status);
      auVar3 = fVar13._0_12_;
      a_02._12_4_ = 0;
      a_02.low = auVar3._0_8_;
      a_02.high = auVar3._8_2_;
      a_02._10_2_ = auVar3._10_2_;
      b_01._8_8_ = 0x3ffe;
      b_01.low = 0xb17217f7d1cf79ac;
      fVar13 = floatx80_mul_m68k(a_02,b_01,status);
      local_60 = fVar13.low;
      local_40 = CONCAT44(local_40._4_4_,fVar13._8_4_);
      local_58 = (undefined4)fVar14.low;
      uStack_54 = fVar14.low._4_4_;
      auVar3 = fVar14._0_12_;
      a_03._12_4_ = 0;
      a_03.low = auVar3._0_8_;
      a_03.high = auVar3._8_2_;
      a_03._10_2_ = auVar3._10_2_;
      b_02._12_4_ = 0;
      b_02.low = auVar3._0_8_;
      b_02.high = auVar3._8_2_;
      b_02._10_2_ = auVar3._10_2_;
      fVar15 = floatx80_mul_m68k(a_03,b_02,status);
      fVar13 = float64_to_floatx80_m68k(0x3fc2499ab5e4040b,status);
      b_03._8_8_ = fVar13._8_8_ & 0xffffffff;
      auVar3 = fVar15._0_12_;
      a_04._12_4_ = 0;
      a_04.low = auVar3._0_8_;
      a_04.high = auVar3._8_2_;
      a_04._10_2_ = auVar3._10_2_;
      b_03.low = fVar13.low;
      fVar13 = floatx80_mul_m68k(a_04,b_03,status);
      fVar16 = float64_to_floatx80_m68k(0xbfc555b5848cb7db,status);
      b_04._8_8_ = fVar16._8_8_ & 0xffffffff;
      a_05._12_4_ = 0;
      a_05.low = auVar3._0_8_;
      a_05.high = auVar3._8_2_;
      a_05._10_2_ = auVar3._10_2_;
      b_04.low = fVar16.low;
      fVar16 = floatx80_mul_m68k(a_05,b_04,status);
      fVar17 = float64_to_floatx80_m68k(0x3fc99999987d8730,status);
      b_05._8_8_ = fVar17._8_8_ & 0xffffffff;
      auVar4 = fVar13._0_12_;
      a_06._12_4_ = 0;
      a_06.low = auVar4._0_8_;
      a_06.high = auVar4._8_2_;
      a_06._10_2_ = auVar4._10_2_;
      b_05.low = fVar17.low;
      fVar13 = floatx80_add_m68k(a_06,b_05,status);
      fVar17 = float64_to_floatx80_m68k(0xbfcfffffff6f7e97,status);
      b_06._8_8_ = fVar17._8_8_ & 0xffffffff;
      auVar4 = fVar16._0_12_;
      a_07._12_4_ = 0;
      a_07.low = auVar4._0_8_;
      a_07.high = auVar4._8_2_;
      a_07._10_2_ = auVar4._10_2_;
      b_06.low = fVar17.low;
      fVar16 = floatx80_add_m68k(a_07,b_06,status);
      auVar4 = fVar13._0_12_;
      a_08._12_4_ = 0;
      a_08.low = auVar4._0_8_;
      a_08.high = auVar4._8_2_;
      a_08._10_2_ = auVar4._10_2_;
      b_07._12_4_ = 0;
      b_07.low = auVar3._0_8_;
      b_07.high = auVar3._8_2_;
      b_07._10_2_ = auVar3._10_2_;
      local_38 = fVar15.low;
      fVar13 = floatx80_mul_m68k(a_08,b_07,status);
      auVar4 = fVar16._0_12_;
      a_09._12_4_ = 0;
      a_09.low = auVar4._0_8_;
      a_09.high = auVar4._8_2_;
      a_09._10_2_ = auVar4._10_2_;
      b_08._12_4_ = 0;
      b_08.low = auVar3._0_8_;
      b_08.high = auVar3._8_2_;
      b_08._10_2_ = auVar3._10_2_;
      fVar16 = floatx80_mul_m68k(a_09,b_08,status);
      fVar17 = float64_to_floatx80_m68k(0x3fd55555555555a4,status);
      b_09._8_8_ = fVar17._8_8_ & 0xffffffff;
      auVar3 = fVar13._0_12_;
      a_10._12_4_ = 0;
      a_10.low = auVar3._0_8_;
      a_10.high = auVar3._8_2_;
      a_10._10_2_ = auVar3._10_2_;
      b_09.low = fVar17.low;
      fVar17 = floatx80_add_m68k(a_10,b_09,status);
      fVar13 = float64_to_floatx80_m68k(0xbfe0000000000008,status);
      b_10._8_8_ = fVar13._8_8_ & 0xffffffff;
      auVar3 = fVar16._0_12_;
      a_11._12_4_ = 0;
      a_11.low = auVar3._0_8_;
      a_11.high = auVar3._8_2_;
      a_11._10_2_ = auVar3._10_2_;
      b_10.low = fVar13.low;
      fVar16 = floatx80_add_m68k(a_11,b_10,status);
      fVar13.low = local_38;
      auVar3 = fVar17._0_12_;
      a_12._12_4_ = 0;
      a_12.low = auVar3._0_8_;
      a_12.high = auVar3._8_2_;
      a_12._10_2_ = auVar3._10_2_;
      b_11._8_4_ = fVar15._8_4_;
      b_11.low = local_38;
      b_11._12_4_ = 0;
      fVar17 = floatx80_mul_m68k(a_12,b_11,status);
      auVar3 = fVar16._0_12_;
      a_13._12_4_ = 0;
      a_13.low = auVar3._0_8_;
      a_13.high = auVar3._8_2_;
      a_13._10_2_ = auVar3._10_2_;
      b_12._8_4_ = fVar15._8_4_;
      b_12.low = fVar13.low;
      b_12._12_4_ = 0;
      fVar13 = floatx80_mul_m68k(a_13,b_12,status);
      uVar5 = CONCAT44(uStack_54,local_58);
      auVar3 = fVar17._0_12_;
      a_14._12_4_ = 0;
      a_14.low = auVar3._0_8_;
      a_14.high = auVar3._8_2_;
      a_14._10_2_ = auVar3._10_2_;
      b_13._8_4_ = fVar14._8_4_;
      b_13.low = uVar5;
      b_13._12_4_ = 0;
      fVar15 = floatx80_mul_m68k(a_14,b_13,status);
      a_15._8_4_ = fVar14._8_4_;
      a_15.low = uVar5;
      a_15._12_4_ = 0;
      auVar3 = fVar13._0_12_;
      b_14._12_4_ = 0;
      b_14.low = auVar3._0_8_;
      b_14.high = auVar3._8_2_;
      b_14._10_2_ = auVar3._10_2_;
      fVar13 = floatx80_add_m68k(a_15,b_14,status);
      auVar3 = fVar15._0_12_;
      a_16._12_4_ = 0;
      a_16.low = auVar3._0_8_;
      a_16.high = auVar3._8_2_;
      a_16._10_2_ = auVar3._10_2_;
      b_15._12_4_ = 0;
      b_15._0_12_ = *(undefined1 (*) [12])((long)&log_tbl[1].low + local_48);
      fVar14 = floatx80_add_m68k(a_16,b_15,status);
      b_16._8_8_ = fVar14._8_8_ & 0xffffffff;
      auVar3 = fVar13._0_12_;
      a_17._12_4_ = 0;
      a_17.low = auVar3._0_8_;
      a_17.high = auVar3._8_2_;
      a_17._10_2_ = auVar3._10_2_;
      b_16.low = fVar14.low;
      fVar13 = floatx80_add_m68k(a_17,b_16,status);
      uVar6 = fVar13.low;
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      uVar7 = fVar13._8_4_;
      fVar13.low = local_60;
      uVar9 = (undefined4)local_40;
    }
    else {
      fVar15 = float32_to_floatx80_m68k(0x3f800000,status);
      b_17._8_8_ = fVar15._8_8_ & 0xffffffff;
      fVar14._8_8_ = uVar10;
      fVar14.low = fVar13.low;
      b_17.low = fVar15.low;
      fVar14 = floatx80_sub_m68k(fVar14,b_17,status);
      fVar16 = float32_to_floatx80_m68k(0x3f800000,status);
      b_18._8_8_ = fVar16._8_8_ & 0xffffffff;
      fVar15._8_8_ = uVar10;
      fVar15.low = fVar13.low;
      b_18.low = fVar16.low;
      fVar13 = floatx80_add_m68k(fVar15,b_18,status);
      auVar3 = fVar14._0_12_;
      fVar16._12_4_ = 0;
      fVar16.low = auVar3._0_8_;
      fVar16.high = auVar3._8_2_;
      fVar16._10_2_ = auVar3._10_2_;
      b_19._12_4_ = 0;
      b_19.low = auVar3._0_8_;
      b_19.high = auVar3._8_2_;
      b_19._10_2_ = auVar3._10_2_;
      fVar14 = floatx80_add_m68k(fVar16,b_19,status);
      auVar3 = fVar14._0_12_;
      fVar17._12_4_ = 0;
      fVar17.low = auVar3._0_8_;
      fVar17.high = auVar3._8_2_;
      fVar17._10_2_ = auVar3._10_2_;
      auVar3 = fVar13._0_12_;
      b_20._12_4_ = 0;
      b_20.low = auVar3._0_8_;
      b_20.high = auVar3._8_2_;
      b_20._10_2_ = auVar3._10_2_;
      fVar13 = floatx80_div_m68k(fVar17,b_20,status);
      local_40 = fVar13.low;
      b_21._8_8_ = fVar13._8_8_ & 0xffffffff;
      b_30._8_4_ = fVar13._8_4_;
      a_18._8_8_ = fVar13._8_8_ & 0xffffffff;
      a_18.low = local_40;
      b_21.low = local_40;
      fVar13 = floatx80_mul_m68k(a_18,b_21,status);
      local_48 = fVar13.low;
      b_22._8_8_ = fVar13._8_8_ & 0xffffffff;
      b_28._8_4_ = fVar13._8_4_;
      a_19._8_8_ = fVar13._8_8_ & 0xffffffff;
      a_19.low = local_48;
      b_22.low = local_48;
      fVar13 = floatx80_mul_m68k(a_19,b_22,status);
      local_60 = fVar13.low;
      uVar9 = fVar13._8_4_;
      fVar14 = float64_to_floatx80_m68k(0x3f175496add7dad6,status);
      fVar15 = float64_to_floatx80_m68k(0x3f3c71c2fe80c7e0,status);
      fVar13.low = local_60;
      auVar3 = fVar14._0_12_;
      a_20._12_4_ = 0;
      a_20.low = auVar3._0_8_;
      a_20.high = auVar3._8_2_;
      a_20._10_2_ = auVar3._10_2_;
      b_23._8_4_ = uVar9;
      b_23.low = local_60;
      b_23._12_4_ = 0;
      fVar14 = floatx80_mul_m68k(a_20,b_23,status);
      local_58 = (undefined4)fVar14.low;
      uStack_54 = fVar14.low._4_4_;
      auVar3 = fVar15._0_12_;
      a_21._12_4_ = 0;
      a_21.low = auVar3._0_8_;
      a_21.high = auVar3._8_2_;
      a_21._10_2_ = auVar3._10_2_;
      b_24._8_4_ = uVar9;
      b_24.low = fVar13.low;
      b_24._12_4_ = 0;
      fVar13 = floatx80_mul_m68k(a_21,b_24,status);
      fVar15 = float64_to_floatx80_m68k(0x3f624924928bccff,status);
      b_25._8_8_ = fVar15._8_8_ & 0xffffffff;
      a_22.low._4_4_ = uStack_54;
      a_22.low._0_4_ = local_58;
      a_22._8_4_ = fVar14._8_4_;
      a_22._12_4_ = 0;
      b_25.low = fVar15.low;
      fVar14 = floatx80_add_m68k(a_22,b_25,status);
      fVar15 = float64_to_floatx80_m68k(0x3f899999999995ec,status);
      b_26._8_8_ = fVar15._8_8_ & 0xffffffff;
      auVar3 = fVar13._0_12_;
      a_23._12_4_ = 0;
      a_23.low = auVar3._0_8_;
      a_23.high = auVar3._8_2_;
      a_23._10_2_ = auVar3._10_2_;
      b_26.low = fVar15.low;
      fVar13 = floatx80_add_m68k(a_23,b_26,status);
      a_24._8_4_ = uVar9;
      a_24.low = local_60;
      a_24._12_4_ = 0;
      auVar3 = fVar14._0_12_;
      b_27._12_4_ = 0;
      b_27.low = auVar3._0_8_;
      b_27.high = auVar3._8_2_;
      b_27._10_2_ = auVar3._10_2_;
      fVar14 = floatx80_mul_m68k(a_24,b_27,status);
      uVar10 = local_48;
      auVar3 = fVar13._0_12_;
      a_25._12_4_ = 0;
      a_25.low = auVar3._0_8_;
      a_25.high = auVar3._8_2_;
      a_25._10_2_ = auVar3._10_2_;
      b_28.low = local_48;
      b_28._12_4_ = 0;
      fVar13 = floatx80_mul_m68k(a_25,b_28,status);
      local_60 = fVar13.low;
      local_58 = fVar13._8_4_;
      fVar13 = float64_to_floatx80_m68k(0x3fb5555555555555,status);
      b_29._8_8_ = fVar13._8_8_ & 0xffffffff;
      auVar3 = fVar14._0_12_;
      a_26._12_4_ = 0;
      a_26.low = auVar3._0_8_;
      a_26.high = auVar3._8_2_;
      a_26._10_2_ = auVar3._10_2_;
      b_29.low = fVar13.low;
      fVar14 = floatx80_add_m68k(a_26,b_29,status);
      fVar13.low = local_40;
      a_27._8_4_ = b_28._8_4_;
      a_27.low = uVar10;
      a_27._12_4_ = 0;
      b_30.low = local_40;
      b_30._12_4_ = 0;
      fVar15 = floatx80_mul_m68k(a_27,b_30,status);
      b_31._8_4_ = local_58;
      b_31.low = local_60;
      auVar3 = fVar14._0_12_;
      a_28._12_4_ = 0;
      a_28.low = auVar3._0_8_;
      a_28.high = auVar3._8_2_;
      a_28._10_2_ = auVar3._10_2_;
      b_31._12_4_ = 0;
      fVar14 = floatx80_add_m68k(a_28,b_31,status);
      b_32._8_8_ = fVar14._8_8_ & 0xffffffff;
      auVar3 = fVar15._0_12_;
      a_29._12_4_ = 0;
      a_29.low = auVar3._0_8_;
      a_29.high = auVar3._8_2_;
      a_29._10_2_ = auVar3._10_2_;
      b_32.low = fVar14.low;
      fVar14 = floatx80_mul_m68k(a_29,b_32,status);
      uVar6 = fVar14.low;
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      uVar7 = fVar14._8_4_;
      uVar9 = b_30._8_4_;
    }
    a_30._8_4_ = uVar7;
    a_30.low = uVar6;
    a_30._12_4_ = 0;
    b_33._8_4_ = uVar9;
    b_33.low = fVar13.low;
    b_33._12_4_ = 0;
    fVar13 = floatx80_add_m68k(a_30,b_33,status);
    uVar9 = fVar13._8_4_;
    float_raise_m68k(' ',status);
  }
LAB_006f07c2:
  fVar18._8_4_ = uVar9;
  fVar18.low = fVar13.low;
  fVar18._12_4_ = 0;
  return fVar18;
}

Assistant:

floatx80 floatx80_logn(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig, fSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact, j, k, adjk;
    floatx80 fp0, fp1, fp2, fp3, f, logof2, klog2, saveu;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            propagateFloatx80NaNOneArg(a, status);
        }
        if (aSign == 0) {
            return packFloatx80(0, floatx80_infinity.high,
                                floatx80_infinity.low);
        }
    }

    adjk = 0;

    if (aExp == 0) {
        if (aSig == 0) { /* zero */
            float_raise(float_flag_divbyzero, status);
            return packFloatx80(1, floatx80_infinity.high,
                                floatx80_infinity.low);
        }
        if ((aSig & one_sig) == 0) { /* denormal */
            normalizeFloatx80Subnormal(aSig, &aExp, &aSig);
            adjk = -100;
            aExp += 100;
            a = packFloatx80(aSign, aExp, aSig);
        }
    }

    if (aSign) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    compact = floatx80_make_compact(aExp, aSig);

    if (compact < 0x3FFEF07D || compact > 0x3FFF8841) {
        /* |X| < 15/16 or |X| > 17/16 */
        k = aExp - 0x3FFF;
        k += adjk;
        fp1 = int32_to_floatx80(k, status);

        fSig = (aSig & UINT64_C(0xFE00000000000000)) | UINT64_C(0x0100000000000000);
        j = (fSig >> 56) & 0x7E; /* DISPLACEMENT FOR 1/F */

        f = packFloatx80(0, 0x3FFF, fSig); /* F */
        fp0 = packFloatx80(0, 0x3FFF, aSig); /* Y */

        fp0 = floatx80_sub(fp0, f, status); /* Y-F */

        /* LP1CONT1 */
        fp0 = floatx80_mul(fp0, log_tbl[j], status); /* FP0 IS U = (Y-F)/F */
        logof2 = packFloatx80(0, 0x3FFE, UINT64_C(0xB17217F7D1CF79AC));
        klog2 = floatx80_mul(fp1, logof2, status); /* FP1 IS K*LOG2 */
        fp2 = floatx80_mul(fp0, fp0, status); /* FP2 IS V=U*U */

        fp3 = fp2;
        fp1 = fp2;

        fp1 = floatx80_mul(fp1, float64_to_floatx80(
                           make_float64(0x3FC2499AB5E4040B), status),
                           status); /* V*A6 */
        fp2 = floatx80_mul(fp2, float64_to_floatx80(
                           make_float64(0xBFC555B5848CB7DB), status),
                           status); /* V*A5 */
        fp1 = floatx80_add(fp1, float64_to_floatx80(
                           make_float64(0x3FC99999987D8730), status),
                           status); /* A4+V*A6 */
        fp2 = floatx80_add(fp2, float64_to_floatx80(
                           make_float64(0xBFCFFFFFFF6F7E97), status),
                           status); /* A3+V*A5 */
        fp1 = floatx80_mul(fp1, fp3, status); /* V*(A4+V*A6) */
        fp2 = floatx80_mul(fp2, fp3, status); /* V*(A3+V*A5) */
        fp1 = floatx80_add(fp1, float64_to_floatx80(
                           make_float64(0x3FD55555555555A4), status),
                           status); /* A2+V*(A4+V*A6) */
        fp2 = floatx80_add(fp2, float64_to_floatx80(
                           make_float64(0xBFE0000000000008), status),
                           status); /* A1+V*(A3+V*A5) */
        fp1 = floatx80_mul(fp1, fp3, status); /* V*(A2+V*(A4+V*A6)) */
        fp2 = floatx80_mul(fp2, fp3, status); /* V*(A1+V*(A3+V*A5)) */
        fp1 = floatx80_mul(fp1, fp0, status); /* U*V*(A2+V*(A4+V*A6)) */
        fp0 = floatx80_add(fp0, fp2, status); /* U+V*(A1+V*(A3+V*A5)) */

        fp1 = floatx80_add(fp1, log_tbl[j + 1],
                           status); /* LOG(F)+U*V*(A2+V*(A4+V*A6)) */
        fp0 = floatx80_add(fp0, fp1, status); /* FP0 IS LOG(F) + LOG(1+U) */

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_add(fp0, klog2, status);

        float_raise(float_flag_inexact, status);

        return a;
    } else { /* |X-1| >= 1/16 */
        fp0 = a;
        fp1 = a;
        fp1 = floatx80_sub(fp1, float32_to_floatx80(make_float32(0x3F800000),
                           status), status); /* FP1 IS X-1 */
        fp0 = floatx80_add(fp0, float32_to_floatx80(make_float32(0x3F800000),
                           status), status); /* FP0 IS X+1 */
        fp1 = floatx80_add(fp1, fp1, status); /* FP1 IS 2(X-1) */

        /* LP1CONT2 */
        fp1 = floatx80_div(fp1, fp0, status); /* U */
        saveu = fp1;
        fp0 = floatx80_mul(fp1, fp1, status); /* FP0 IS V = U*U */
        fp1 = floatx80_mul(fp0, fp0, status); /* FP1 IS W = V*V */

        fp3 = float64_to_floatx80(make_float64(0x3F175496ADD7DAD6),
                                  status); /* B5 */
        fp2 = float64_to_floatx80(make_float64(0x3F3C71C2FE80C7E0),
                                  status); /* B4 */
        fp3 = floatx80_mul(fp3, fp1, status); /* W*B5 */
        fp2 = floatx80_mul(fp2, fp1, status); /* W*B4 */
        fp3 = floatx80_add(fp3, float64_to_floatx80(
                           make_float64(0x3F624924928BCCFF), status),
                           status); /* B3+W*B5 */
        fp2 = floatx80_add(fp2, float64_to_floatx80(
                           make_float64(0x3F899999999995EC), status),
                           status); /* B2+W*B4 */
        fp1 = floatx80_mul(fp1, fp3, status); /* W*(B3+W*B5) */
        fp2 = floatx80_mul(fp2, fp0, status); /* V*(B2+W*B4) */
        fp1 = floatx80_add(fp1, float64_to_floatx80(
                           make_float64(0x3FB5555555555555), status),
                           status); /* B1+W*(B3+W*B5) */

        fp0 = floatx80_mul(fp0, saveu, status); /* FP0 IS U*V */
        fp1 = floatx80_add(fp1, fp2, status); /* B1+W*(B3+W*B5) + V*(B2+W*B4) */
        fp0 = floatx80_mul(fp0, fp1,
                           status); /* U*V*([B1+W*(B3+W*B5)] + [V*(B2+W*B4)]) */

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_add(fp0, saveu, status);

        /*if (!floatx80_is_zero(a)) { */
            float_raise(float_flag_inexact, status);
        /*} */

        return a;
    }
}